

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf8.h
# Opt level: O1

void * utf8str(void *haystack,void *needle)

{
  char *in_RAX;
  char *pcVar1;
  char *h;
  char cVar2;
  char cVar3;
  char *pcVar4;
  
  if (*needle == '\0') {
    return haystack;
  }
  do {
    if (*haystack == '\0') {
      return (void *)0x0;
    }
    cVar3 = *haystack;
    cVar2 = *needle;
    pcVar1 = (char *)haystack;
    pcVar4 = (char *)((long)needle + 1);
    if (cVar3 == cVar2) {
      do {
        cVar3 = pcVar1[1];
        pcVar1 = pcVar1 + 1;
        cVar2 = *pcVar4;
        pcVar4 = pcVar4 + 1;
      } while (cVar3 == cVar2);
    }
    if ((cVar2 != '\0') && (haystack = in_RAX, cVar3 != '\0')) {
      pcVar1 = pcVar1 + 1;
    }
    in_RAX = (char *)haystack;
    haystack = pcVar1;
  } while (cVar2 != '\0');
  return in_RAX;
}

Assistant:

void *utf8str(const void *haystack, const void *needle) {
  const char *h = (const char *)haystack;

  // if needle has no utf8 codepoints before the null terminating
  // byte then return haystack
  if ('\0' == *((const char *)needle)) {
    return (void *)haystack;
  }

  while ('\0' != *h) {
    const char *maybeMatch = h;
    const char *n = (const char *)needle;

    while (*h == *n) {
      n++;
      h++;
    }

    if ('\0' == *n) {
      // we found the whole utf8 string for needle in haystack at
      // maybeMatch, so return it
      return (void *)maybeMatch;
    } else {
      // h could be in the middle of an unmatching utf8 codepoint,
      // so we need to march it on to the next character beginning,
      if ('\0' != *h) {
        do {
          h++;
        } while (0x80 == (0xc0 & *h));
      }
    }
  }

  // no match
  return 0;
}